

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O0

void ascon_hash_cleanup(ascon_hash_ctx_t *ctx)

{
  uint_fast8_t i_1;
  uint_fast8_t i;
  ascon_hash_ctx_t *ctx_local;
  
  (ctx->sponge).x0 = 0;
  (ctx->sponge).x1 = 0;
  (ctx->sponge).x2 = 0;
  (ctx->sponge).x3 = 0;
  (ctx->sponge).x4 = 0;
  for (i = '\0'; i < 0x10; i = i + '\x01') {
    ctx->buffer[i] = '\0';
  }
  ctx->buffer_len = '\0';
  ctx->flow_state = '\0';
  for (i_1 = '\0'; i_1 < 6; i_1 = i_1 + '\x01') {
    ctx->pad[i_1] = '\0';
  }
  return;
}

Assistant:

ASCON_API void
ascon_hash_cleanup(ascon_hash_ctx_t* const ctx)
{
    ASCON_ASSERT(ctx != NULL);
    // Manual cleanup using volatile pointers to have more assurance the
    // cleanup will not be removed by the optimiser.
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x0 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x1 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x2 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x3 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x4 = 0U;
    for (uint_fast8_t i = 0; i < ASCON_DOUBLE_RATE; i++)
    {
        ((volatile ascon_aead_ctx_t*) ctx)->bufstate.buffer[i] = 0U;
    }
    ((volatile ascon_hash_ctx_t*) ctx)->buffer_len = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->flow_state = ASCON_FLOW_CLEANED;
    // Clearing also the padding to set the whole context to be all-zeros.
    // Makes it easier to check for initialisation and provides a known
    // state after cleanup, initialising all memory.
    for (uint_fast8_t i = 0U; i < 6U; i++)
    {
        ((volatile ascon_aead_ctx_t*) ctx)->bufstate.pad[i] = 0U;
    }
}